

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O3

bool __thiscall cmListFileParser::ParseFunction(cmListFileParser *this,char *name,long line)

{
  cmMessenger *this_00;
  bool bVar1;
  cmListFileLexer_Token *pcVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  ostream *poVar6;
  Delimiter delim;
  long lVar7;
  anon_enum_32 aVar8;
  cmListFileContext lfc;
  cmListFileBacktrace lfbt;
  ostringstream error;
  undefined1 local_238 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  long local_1f8;
  undefined1 local_1f0 [32];
  long local_1d0;
  cmListFileBacktrace local_1c8;
  undefined1 local_1a8 [24];
  undefined8 uStack_190;
  long local_188;
  vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> avStack_180 [3];
  ios_base local_138 [264];
  
  local_1a8._16_8_ = 0;
  uStack_190 = 0;
  local_1a8._8_8_ = 0;
  local_188 = 0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1d0 = line;
  local_1a8._0_8_ = local_1a8 + 0x10;
  std::__cxx11::string::operator=((string *)&this->Function,(string *)local_1a8);
  (this->Function).super_cmCommandContext.Line = local_188;
  local_238._16_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_238._0_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_238._8_8_ =
       (this->Function).Arguments.
       super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_start =
       avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->Function).Arguments.
  super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl.
  super__Vector_impl_data._M_finish =
       avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  avStack_180[0].super__Vector_base<cmListFileArgument,_std::allocator<cmListFileArgument>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector
            ((vector<cmListFileArgument,_std::allocator<cmListFileArgument>_> *)local_238);
  std::vector<cmListFileArgument,_std::allocator<cmListFileArgument>_>::~vector(avStack_180);
  if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  pcVar5 = (char *)(this->Function).super_cmCommandContext.Name._M_string_length;
  strlen(name);
  std::__cxx11::string::_M_replace((ulong)&this->Function,0,pcVar5,(ulong)name);
  (this->Function).super_cmCommandContext.Line = local_1d0;
  do {
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 == (cmListFileLexer_Token *)0x0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Unexpected end of file.\n",0x18);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Parse error.  Function missing opening \"(\".",0x2b);
      std::__cxx11::stringbuf::str();
      IssueError(this,(string *)local_238);
      goto LAB_00348023;
    }
  } while (pcVar2->type == cmListFileLexer_Token_Space);
  if (pcVar2->type == cmListFileLexer_Token_ParenLeft) {
    this->Separation = SeparationOkay;
    lVar3 = cmListFileLexer_GetCurrentLine(this->Lexer);
    pcVar2 = cmListFileLexer_Scan(this->Lexer);
    if (pcVar2 != (cmListFileLexer_Token *)0x0) {
      lVar7 = 0;
      do {
        if (pcVar2->type - cmListFileLexer_Token_Space < 2) {
          this->Separation = SeparationOkay;
          goto LAB_00347c63;
        }
        switch(pcVar2->type) {
        case cmListFileLexer_Token_Identifier:
        case cmListFileLexer_Token_ArgumentUnquoted:
          bVar1 = AddArgument(this,pcVar2,Unquoted);
          aVar8 = SeparationWarning;
          if (!bVar1) {
            return false;
          }
          break;
        case cmListFileLexer_Token_ParenLeft:
          this->Separation = SeparationOkay;
          bVar1 = AddArgument(this,pcVar2,Unquoted);
          if (!bVar1) {
            return false;
          }
          lVar7 = lVar7 + 1;
          goto LAB_00347c63;
        case cmListFileLexer_Token_ParenRight:
          if (lVar7 == 0) {
            return true;
          }
          this->Separation = SeparationOkay;
          bVar1 = AddArgument(this,pcVar2,Unquoted);
          if (!bVar1) {
            return false;
          }
          lVar7 = lVar7 + -1;
          aVar8 = SeparationWarning;
          break;
        case cmListFileLexer_Token_ArgumentQuoted:
          aVar8 = SeparationWarning;
          delim = Quoted;
          goto LAB_00347d47;
        case cmListFileLexer_Token_ArgumentBracket:
          aVar8 = SeparationError;
          delim = Bracket;
LAB_00347d47:
          bVar1 = AddArgument(this,pcVar2,delim);
          if (!bVar1) {
            return false;
          }
          break;
        case cmListFileLexer_Token_CommentBracket:
          aVar8 = SeparationError;
          break;
        default:
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Parse error.  Function missing ending \")\".  ",0x2c);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Instead found ",0xe);
          pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
          poVar6 = std::operator<<((ostream *)local_1a8,pcVar5);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6," with text \"",0xc);
          poVar6 = std::operator<<(poVar6,pcVar2->text);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\".",2);
          std::__cxx11::stringbuf::str();
          IssueError(this,(string *)local_238);
          goto LAB_00348023;
        }
        this->Separation = aVar8;
LAB_00347c63:
        lVar3 = cmListFileLexer_GetCurrentLine(this->Lexer);
        pcVar2 = cmListFileLexer_Scan(this->Lexer);
      } while (pcVar2 != (cmListFileLexer_Token *)0x0);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    local_238._8_8_ = (pointer)0x0;
    local_238._16_8_ = local_238._16_8_ & 0xffffffffffffff00;
    local_218._8_8_ = 0;
    local_208._M_local_buf[0] = '\0';
    local_1f8 = 0;
    pcVar5 = this->FileName;
    local_238._0_8_ = (pointer)(local_238 + 0x10);
    local_218._M_allocated_capacity = (size_type)&local_208;
    strlen(pcVar5);
    std::__cxx11::string::_M_replace((ulong)&local_218,0,(char *)0x0,(ulong)pcVar5);
    local_1f8 = lVar3;
    cmListFileBacktrace::cmListFileBacktrace(&local_1c8,&this->Backtrace);
    cmListFileBacktrace::cmListFileBacktrace
              ((cmListFileBacktrace *)local_1f0,&local_1c8.Bottom,local_1c8.Cur,
               (cmListFileContext *)local_238);
    cmListFileBacktrace::operator=(&local_1c8,(cmListFileBacktrace *)local_1f0);
    if ((Entry *)local_1f0._24_8_ != (Entry *)0x0) {
      cmListFileBacktrace::Entry::Unref((Entry *)local_1f0._24_8_);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Parse error.  Function missing ending \")\".  ",0x2c);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"End of file reached.",0x14);
    this_00 = this->Messenger;
    std::__cxx11::stringbuf::str();
    cmMessenger::IssueMessage(this_00,FATAL_ERROR,(string *)local_1f0,&local_1c8);
    if ((cmState *)local_1f0._0_8_ != (cmState *)(local_1f0 + 0x10)) {
      operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
    }
    if (local_1c8.Cur != (Entry *)0x0) {
      cmListFileBacktrace::Entry::Unref(local_1c8.Cur);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_allocated_capacity != &local_208) {
      operator_delete((void *)local_218._M_allocated_capacity,
                      CONCAT71(local_208._M_allocated_capacity._1_7_,local_208._M_local_buf[0]) + 1)
      ;
    }
    if ((pointer)local_238._0_8_ == (pointer)(local_238 + 0x10)) goto LAB_0034803e;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Parse error.  Expected \"(\", got ",0x20);
    pcVar5 = cmListFileLexer_GetTypeAsString(this->Lexer,pcVar2->type);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x90);
    }
    else {
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," with text \"",0xc);
    pcVar5 = pcVar2->text;
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)local_238 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18) + 0x90);
    }
    else {
      sVar4 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar5,sVar4);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\".",2);
    std::__cxx11::stringbuf::str();
    IssueError(this,(string *)local_238);
LAB_00348023:
    if ((pointer)local_238._0_8_ == (pointer)(local_238 + 0x10)) goto LAB_0034803e;
  }
  operator_delete((void *)local_238._0_8_,(ulong)(local_238._16_8_ + 1));
LAB_0034803e:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return false;
}

Assistant:

bool cmListFileParser::ParseFunction(const char* name, long line)
{
  // Ininitialize a new function call.
  this->Function = cmListFileFunction();
  this->Function.Name = name;
  this->Function.Line = line;

  // Command name has already been parsed.  Read the left paren.
  cmListFileLexer_Token* token;
  while ((token = cmListFileLexer_Scan(this->Lexer)) &&
         token->type == cmListFileLexer_Token_Space) {
  }
  if (!token) {
    std::ostringstream error;
    /* clang-format off */
    error << "Unexpected end of file.\n"
          << "Parse error.  Function missing opening \"(\".";
    /* clang-format on */
    this->IssueError(error.str());
    return false;
  }
  if (token->type != cmListFileLexer_Token_ParenLeft) {
    std::ostringstream error;
    error << "Parse error.  Expected \"(\", got "
          << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
          << " with text \"" << token->text << "\".";
    this->IssueError(error.str());
    return false;
  }

  // Arguments.
  unsigned long lastLine;
  unsigned long parenDepth = 0;
  this->Separation = SeparationOkay;
  while ((lastLine = cmListFileLexer_GetCurrentLine(this->Lexer),
          token = cmListFileLexer_Scan(this->Lexer))) {
    if (token->type == cmListFileLexer_Token_Space ||
        token->type == cmListFileLexer_Token_Newline) {
      this->Separation = SeparationOkay;
      continue;
    }
    if (token->type == cmListFileLexer_Token_ParenLeft) {
      parenDepth++;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
    } else if (token->type == cmListFileLexer_Token_ParenRight) {
      if (parenDepth == 0) {
        return true;
      }
      parenDepth--;
      this->Separation = SeparationOkay;
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_Identifier ||
               token->type == cmListFileLexer_Token_ArgumentUnquoted) {
      if (!this->AddArgument(token, cmListFileArgument::Unquoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentQuoted) {
      if (!this->AddArgument(token, cmListFileArgument::Quoted)) {
        return false;
      }
      this->Separation = SeparationWarning;
    } else if (token->type == cmListFileLexer_Token_ArgumentBracket) {
      if (!this->AddArgument(token, cmListFileArgument::Bracket)) {
        return false;
      }
      this->Separation = SeparationError;
    } else if (token->type == cmListFileLexer_Token_CommentBracket) {
      this->Separation = SeparationError;
    } else {
      // Error.
      std::ostringstream error;
      error << "Parse error.  Function missing ending \")\".  "
            << "Instead found "
            << cmListFileLexer_GetTypeAsString(this->Lexer, token->type)
            << " with text \"" << token->text << "\".";
      this->IssueError(error.str());
      return false;
    }
  }

  std::ostringstream error;
  cmListFileContext lfc;
  lfc.FilePath = this->FileName;
  lfc.Line = lastLine;
  cmListFileBacktrace lfbt = this->Backtrace;
  lfbt = lfbt.Push(lfc);
  error << "Parse error.  Function missing ending \")\".  "
        << "End of file reached.";
  this->Messenger->IssueMessage(cmake::FATAL_ERROR, error.str(), lfbt);
  return false;
}